

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O1

void print_boolean_expr(BoolExpr *be)

{
  char *__format;
  BoolExprStruct *pBVar1;
  
  switch(be->type) {
  case E_FALSE:
    __format = "false ";
    break;
  case E_TRUE:
    __format = "true ";
    break;
  case E_UNKNOWN:
    __format = "? ";
    break;
  case E_AND:
    printf("(and ");
    __format = ") ";
    for (pBVar1 = be->subexpr; pBVar1 != (BoolExpr *)0x0; pBVar1 = pBVar1->next) {
      print_boolean_expr(pBVar1);
    }
    break;
  case E_OR:
    printf("(or ");
    __format = ") ";
    for (pBVar1 = be->subexpr; pBVar1 != (BoolExpr *)0x0; pBVar1 = pBVar1->next) {
      print_boolean_expr(pBVar1);
    }
    break;
  case E_XOR:
    printf("(xor ");
    __format = ") ";
    for (pBVar1 = be->subexpr; pBVar1 != (BoolExpr *)0x0; pBVar1 = pBVar1->next) {
      print_boolean_expr(pBVar1);
    }
    break;
  case E_NOT:
    printf("(not ");
    print_boolean_expr(be->subexpr);
    __format = ") ";
    break;
  default:
    return;
  }
  printf(__format);
  return;
}

Assistant:

void
print_boolean_expr (const BoolExpr *be)
{
  switch (be->type) {
  case E_TRUE:    printf ("true ");   break;
  case E_FALSE:   printf ("false ");   break;
  case E_UNKNOWN: printf ("? ");    break;
  case E_NOT:
    printf ("(not ");
    print_boolean_expr (be->subexpr);
    printf (") ");
    break;
  case E_AND:
    printf ("(and ");
    for (be=be->subexpr; be != NULL; be=be->next)
      print_boolean_expr (be);
    printf (") ");
    break;
  case E_OR:
    printf ("(or ");
    for (be=be->subexpr; be != NULL; be=be->next)
      print_boolean_expr (be);
    printf (") ");
    break;
  case E_XOR:
    printf ("(xor ");
    for (be=be->subexpr; be != NULL; be=be->next)
      print_boolean_expr (be);
    printf (") ");
    break;
  }
}